

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

TimeZone * __thiscall
icu_63::TimeZoneFormat::parse
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,UnicodeString *text,ParsePosition *pos,
          int32_t parseOptions,UTimeZoneFormatTimeType *timeType)

{
  short sVar1;
  uint start;
  uint32_t types;
  bool bVar2;
  UErrorCode UVar3;
  int32_t iVar4;
  int iVar5;
  UTimeZoneNameType UVar6;
  UTimeZoneFormatTimeType UVar7;
  undefined4 extraout_var;
  TimeZone *pTVar8;
  undefined4 extraout_var_00;
  TimeZoneFormat *pTVar9;
  TimeZoneFormat *pTVar10;
  TimeZoneFormat *pTVar11;
  undefined4 extraout_var_01;
  TimeZoneFormat *this_00;
  undefined4 extraout_var_03;
  int32_t matchIdx;
  uint uVar12;
  int32_t i_2;
  uint idx;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int32_t i;
  int iVar16;
  ulong uStackY_1b0;
  UErrorCode status;
  int32_t local_190;
  int local_18c;
  ParsePosition tmpPos;
  uint local_164;
  UBool hasDigitOffset_2;
  uint local_154;
  UChar *local_150;
  ulong local_148;
  TimeZone *local_140;
  UnicodeString tzID;
  UnicodeString parsedID;
  UChar parsedIDBuf [32];
  UChar tzIDBuf [32];
  undefined4 extraout_var_02;
  
  pTVar8 = (TimeZone *)(ulong)style;
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  start = pos->index;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    local_18c = (text->fUnion).fFields.fLength;
  }
  else {
    local_18c = (int)sVar1 >> 5;
  }
  tmpPos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_00467010;
  tmpPos.errorIndex = -1;
  tmpPos.index = start;
  local_154 = parseOptions;
  local_150 = (UChar *)timeType;
  if ((((style < UTZFMT_STYLE_SPECIFIC_SHORT & 0xbU >> ((byte)style & 0xf)) == 0) &&
      (style != UTZFMT_STYLE_SPECIFIC_SHORT)) && (style != UTZFMT_STYLE_GENERIC_SHORT)) {
    uVar12 = 0xffffffff;
    local_164 = 0;
    local_190 = 0x7fffffff;
  }
  else {
    tzIDBuf[0]._0_1_ = '\0';
    pTVar11 = this;
    local_190 = parseOffsetLocalizedGMT
                          (this,text,&tmpPos,(style - UTZFMT_STYLE_GENERIC_SHORT & 0xfffffffd) == 0,
                           (UBool *)tzIDBuf);
    if (tmpPos.errorIndex == -1) {
      if ((tmpPos.index == local_18c) || (uVar12 = tmpPos.index, (char)tzIDBuf[0] != '\0')) {
        pos->index = tmpPos.index;
        pTVar8 = createTimeZoneForOffset(pTVar11,local_190);
        goto LAB_00277b50;
      }
    }
    else {
      local_190 = 0x7fffffff;
      uVar12 = 0xffffffff;
    }
    local_164 = 0x60;
  }
  status = U_ZERO_ERROR;
  pTVar11 = (TimeZoneFormat *)&tzID;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)pTVar11,tzIDBuf,0,0x20);
  local_140 = pTVar8;
  switch(pTVar8) {
  case (TimeZone *)0x0:
    types = 1;
    goto LAB_002774f5;
  case (TimeZone *)0x1:
    types = 3;
    goto LAB_002774f5;
  case (TimeZone *)0x2:
    types = 5;
LAB_002774f5:
    parsedIDBuf[0] = L'\0';
    parsedIDBuf[1] = L'\0';
    pTVar11 = (TimeZoneFormat *)getTimeZoneGenericNames(this,&status);
    if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
       (iVar4 = TimeZoneGenericNames::findBestMatch
                          ((TimeZoneGenericNames *)pTVar11,text,start,types,&tzID,
                           (UTimeZoneFormatTimeType *)parsedIDBuf,&status),
       status < U_ILLEGAL_ARGUMENT_ERROR)) {
      if (iVar4 < 1) break;
      if (local_150 != (UChar *)0x0) {
        *(undefined4 *)local_150 = parsedIDBuf._0_4_;
      }
      pos->index = iVar4 + start;
      pTVar8 = TimeZone::createTimeZone(&tzID);
    }
    else {
      pos->errorIndex = start;
      pTVar8 = (TimeZone *)0x0;
    }
    goto LAB_00277b46;
  case (TimeZone *)0x3:
    uStackY_1b0 = 6;
    goto LAB_002774a6;
  case (TimeZone *)0x4:
    uStackY_1b0 = 0x30;
LAB_002774a6:
    pTVar11 = (TimeZoneFormat *)this->fTimeZoneNames;
    iVar5 = (*(pTVar11->super_Format).super_UObject._vptr_UObject[0xf])
                      (pTVar11,text,(ulong)start,uStackY_1b0,&status);
    pTVar10 = (TimeZoneFormat *)CONCAT44(extraout_var,iVar5);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (pTVar10 != (TimeZoneFormat *)0x0) {
        local_148 = CONCAT44(local_148._4_4_,(int)uStackY_1b0);
        iVar5 = -1;
        uVar15 = 0xffffffff;
        for (iVar16 = 0; pTVar11 = pTVar10,
            iVar4 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar10),
            iVar16 < iVar4; iVar16 = iVar16 + 1) {
          iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                            ((MatchInfoCollection *)pTVar10,iVar16);
          uVar15 = iVar4 + start;
          if ((int)uVar12 < (int)uVar15) {
            iVar5 = iVar16;
            uVar12 = uVar15;
          }
        }
        if (-1 < iVar5) {
          if (local_150 != (UChar *)0x0) {
            UVar6 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                              ((MatchInfoCollection *)pTVar10,iVar5);
            UVar7 = getTimeType(UVar6);
            *(UTimeZoneFormatTimeType *)local_150 = UVar7;
          }
          pos->index = uVar15;
          getTimeZoneID(this,(MatchInfoCollection *)pTVar10,iVar5,&tzID);
          pTVar11 = (TimeZoneFormat *)&tzID;
          pTVar8 = TimeZone::createTimeZone((UnicodeString *)pTVar11);
          bVar2 = false;
          goto LAB_00277a2d;
        }
        uStackY_1b0 = local_148 & 0xffffffff;
      }
      bVar2 = true;
      if ((style == UTZFMT_STYLE_SPECIFIC_SHORT && (local_154 & 2) != 0) &&
         (pTVar11 = this, pTVar9 = (TimeZoneFormat *)getTZDBTimeZoneNames(this,&status),
         status < U_ILLEGAL_ARGUMENT_ERROR)) {
        iVar5 = (*(pTVar9->super_Format).super_UObject._vptr_UObject[0xf])
                          (pTVar9,text,(ulong)start,uStackY_1b0,&status);
        this_00 = (TimeZoneFormat *)CONCAT44(extraout_var_02,iVar5);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          pTVar11 = pTVar9;
          if (this_00 == (TimeZoneFormat *)0x0) goto LAB_00277a2d;
          iVar5 = -1;
          pTVar8 = (TimeZone *)0xffffffff;
          for (iVar16 = 0; pTVar9 = this_00,
              iVar4 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)this_00),
              iVar16 < iVar4; iVar16 = iVar16 + 1) {
            iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                              ((MatchInfoCollection *)this_00,iVar16);
            uVar15 = iVar4 + start;
            pTVar8 = (TimeZone *)(ulong)uVar15;
            if ((int)uVar12 < (int)uVar15) {
              iVar5 = iVar16;
              uVar12 = uVar15;
            }
          }
          if (iVar5 < 0) {
            bVar2 = true;
          }
          else {
            if (local_150 != (UChar *)0x0) {
              UVar6 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                ((MatchInfoCollection *)this_00,iVar5);
              UVar7 = getTimeType(UVar6);
              *(UTimeZoneFormatTimeType *)local_150 = UVar7;
            }
            pos->index = (int32_t)pTVar8;
            getTimeZoneID(this,(MatchInfoCollection *)this_00,iVar5,&tzID);
            pTVar9 = (TimeZoneFormat *)&tzID;
            pTVar8 = TimeZone::createTimeZone((UnicodeString *)pTVar9);
            bVar2 = false;
          }
        }
        else {
          pos->errorIndex = start;
          bVar2 = false;
          pTVar8 = (TimeZone *)0x0;
        }
        pTVar11 = pTVar9;
        if (this_00 != (TimeZoneFormat *)0x0) {
          (*(this_00->super_Format).super_UObject._vptr_UObject[1])();
          pTVar11 = this_00;
        }
      }
    }
    else {
      pos->errorIndex = start;
      bVar2 = false;
      pTVar8 = (TimeZone *)0x0;
    }
LAB_00277a2d:
    if (pTVar10 != (TimeZoneFormat *)0x0) {
      (*(pTVar10->super_Format).super_UObject._vptr_UObject[1])();
      pTVar11 = pTVar10;
    }
    if (bVar2) break;
    goto LAB_00277b46;
  case (TimeZone *)0x5:
    tmpPos.errorIndex = -1;
    pTVar11 = this;
    tmpPos.index = start;
    iVar4 = parseOffsetLocalizedGMT(this,text,&tmpPos);
    uVar15 = tmpPos.index;
    if (tmpPos.errorIndex != -1) {
      local_164 = local_164 | 0x40;
      break;
    }
    goto LAB_002776e1;
  case (TimeZone *)0x6:
    tmpPos.errorIndex = -1;
    pTVar11 = this;
    tmpPos.index = start;
    iVar4 = parseOffsetShortLocalizedGMT(this,text,&tmpPos);
    uVar15 = tmpPos.index;
    if (tmpPos.errorIndex == -1) goto LAB_002776e1;
    local_164 = local_164 | 0x20;
    break;
  case (TimeZone *)0x7:
  case (TimeZone *)0x9:
  case (TimeZone *)0xb:
  case (TimeZone *)0xd:
  case (TimeZone *)0xf:
    tmpPos.errorIndex = -1;
    pTVar11 = this;
    tmpPos.index = start;
    iVar4 = parseOffsetISO8601(this,text,&tmpPos);
    uVar15 = tmpPos.index;
    if (tmpPos.errorIndex == -1) goto LAB_002776e1;
    break;
  case (TimeZone *)0x8:
  case (TimeZone *)0xa:
  case (TimeZone *)0xc:
  case (TimeZone *)0xe:
  case (TimeZone *)0x10:
    tmpPos.errorIndex = -1;
    parsedIDBuf._0_4_ = parsedIDBuf._0_4_ & 0xffffff00;
    tmpPos.index = start;
    iVar4 = parseOffsetISO8601(pTVar11,text,&tmpPos,'\0',(UBool *)parsedIDBuf);
    if ((tmpPos.errorIndex != -1) || ((char)parsedIDBuf[0] == '\0')) break;
    pos->index = tmpPos.index;
    pTVar8 = createTimeZoneForOffset(pTVar11,iVar4);
    goto LAB_00277b46;
  case (TimeZone *)0x11:
    tmpPos.errorIndex = -1;
    tmpPos.index = start;
    parseZoneID(pTVar11,text,&tmpPos,&tzID);
    goto LAB_002775e6;
  case (TimeZone *)0x12:
    tmpPos.errorIndex = -1;
    tmpPos.index = start;
    parseShortZoneID(pTVar11,text,&tmpPos,&tzID);
    goto LAB_002775e6;
  case (TimeZone *)0x13:
    tmpPos.errorIndex = -1;
    pTVar11 = this;
    tmpPos.index = start;
    parseExemplarLocation(this,text,&tmpPos,&tzID);
LAB_002775e6:
    if (tmpPos.errorIndex != -1) break;
    pos->index = tmpPos.index;
    pTVar8 = TimeZone::createTimeZone(&tzID);
    goto LAB_00277b46;
  }
  uVar15 = uVar12;
  iVar4 = local_190;
  if ((int)start < (int)uVar12) {
LAB_002776e1:
    local_190 = iVar4;
    pos->index = uVar15;
    pTVar8 = createTimeZoneForOffset(pTVar11,local_190);
  }
  else {
    uVar15 = (uint)*(ushort *)(STYLE_PARSE_FLAGS + (long)local_140 * 2);
    pTVar11 = (TimeZoneFormat *)&parsedID;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)pTVar11,parsedIDBuf,0,0x20);
    if (((int)uVar12 < local_18c) && ((uVar15 & 0x180) != 0x180)) {
      tmpPos.errorIndex = -1;
      _hasDigitOffset_2 = _hasDigitOffset_2 & 0xffffff00;
      tmpPos.index = start;
      iVar4 = parseOffsetISO8601(pTVar11,text,&tmpPos,'\0',&hasDigitOffset_2);
      if (tmpPos.errorIndex != -1) goto LAB_0027776a;
      if ((tmpPos.index != local_18c) && (hasDigitOffset_2 == '\0')) {
        if ((int)uVar12 < tmpPos.index) {
          pTVar11 = (TimeZoneFormat *)&parsedID;
          icu_63::UnicodeString::setToBogus((UnicodeString *)pTVar11);
          uVar12 = tmpPos.index;
          local_190 = iVar4;
        }
        goto LAB_0027776a;
      }
      pos->index = tmpPos.index;
      pTVar8 = createTimeZoneForOffset(pTVar11,iVar4);
    }
    else {
LAB_0027776a:
      if (((int)uVar12 < local_18c) && (((local_164 | uVar15) & 0x20) == 0)) {
        tmpPos.errorIndex = -1;
        _hasDigitOffset_2 = _hasDigitOffset_2 & 0xffffff00;
        pTVar11 = this;
        tmpPos.index = start;
        iVar4 = parseOffsetLocalizedGMT(this,text,&tmpPos,'\0',&hasDigitOffset_2);
        if (tmpPos.errorIndex == -1) {
          if ((tmpPos.index == local_18c) || (hasDigitOffset_2 != '\0')) {
            pos->index = tmpPos.index;
            pTVar8 = createTimeZoneForOffset(pTVar11,iVar4);
            goto LAB_00277b39;
          }
          if ((int)uVar12 < tmpPos.index) {
            pTVar11 = (TimeZoneFormat *)&parsedID;
            icu_63::UnicodeString::setToBogus((UnicodeString *)pTVar11);
            uVar12 = tmpPos.index;
            local_190 = iVar4;
          }
        }
      }
      local_140 = (TimeZone *)CONCAT44(local_140._4_4_,uVar15);
      if (((int)uVar12 < local_18c) && (((local_164 | uVar15) & 0x40) == 0)) {
        tmpPos.errorIndex = -1;
        _hasDigitOffset_2 = _hasDigitOffset_2 & 0xffffff00;
        pTVar11 = this;
        tmpPos.index = start;
        iVar4 = parseOffsetLocalizedGMT(this,text,&tmpPos,'\x01',&hasDigitOffset_2);
        if (tmpPos.errorIndex == -1) {
          if ((tmpPos.index == local_18c) || (hasDigitOffset_2 != '\0')) {
            pos->index = tmpPos.index;
            pTVar8 = createTimeZoneForOffset(pTVar11,iVar4);
            goto LAB_00277b39;
          }
          if ((int)uVar12 < tmpPos.index) {
            pTVar11 = (TimeZoneFormat *)&parsedID;
            icu_63::UnicodeString::setToBogus((UnicodeString *)pTVar11);
            uVar12 = tmpPos.index;
            local_190 = iVar4;
          }
        }
      }
      UVar7 = UTZFMT_TIME_TYPE_UNKNOWN;
      if ((local_154 & 1) == 0) {
LAB_0027783a:
        if ((int)start < (int)uVar12) {
          if (-1 < parsedID.fUnion.fStackFields.fLengthAndFlags) {
            parsedID.fUnion.fFields.fLength = (int)parsedID.fUnion.fStackFields.fLengthAndFlags >> 5
            ;
          }
          if (parsedID.fUnion.fFields.fLength < 1) {
            pTVar8 = createTimeZoneForOffset(pTVar11,local_190);
          }
          else {
            pTVar8 = TimeZone::createTimeZone(&parsedID);
          }
          if (local_150 != (UChar *)0x0) {
            *(UTimeZoneFormatTimeType *)local_150 = UVar7;
          }
          pos->index = uVar12;
          goto LAB_00277b39;
        }
      }
      else {
        uVar14 = 0;
        if ((int)uVar12 < local_18c) {
          pTVar11 = (TimeZoneFormat *)this->fTimeZoneNames;
          iVar5 = (*(pTVar11->super_Format).super_UObject._vptr_UObject[0xf])
                            (pTVar11,text,(ulong)start,0x76,&status);
          UVar3 = status;
          pTVar10 = (TimeZoneFormat *)CONCAT44(extraout_var_00,iVar5);
          if (status < U_ILLEGAL_ARGUMENT_ERROR) {
            if (pTVar10 == (TimeZoneFormat *)0x0) {
              uVar15 = 0xffffffff;
              uVar13 = uVar15;
            }
            else {
              uVar15 = 0xffffffff;
              uVar13 = 0xffffffff;
              for (idx = 0; pTVar11 = pTVar10,
                  iVar4 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar10),
                  (int)idx < iVar4; idx = idx + 1) {
                iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                  ((MatchInfoCollection *)pTVar10,idx);
                if ((int)uVar15 < (int)(iVar4 + start)) {
                  iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    ((MatchInfoCollection *)pTVar10,idx);
                  uVar15 = iVar4 + start;
                  uVar13 = idx;
                }
              }
            }
            uVar14 = 0;
            if ((int)uVar12 < (int)uVar15) {
              getTimeZoneID(this,(MatchInfoCollection *)pTVar10,uVar13,&parsedID);
              UVar6 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                ((MatchInfoCollection *)pTVar10,uVar13);
              pTVar11 = (TimeZoneFormat *)(ulong)UVar6;
              UVar7 = getTimeType(UVar6);
              uVar14 = (ulong)UVar7;
              local_190 = 0x7fffffff;
              uVar12 = uVar15;
            }
          }
          else {
            pos->errorIndex = start;
            uVar14 = 0;
            pTVar8 = (TimeZone *)0x0;
          }
          if (pTVar10 != (TimeZoneFormat *)0x0) {
            (*(pTVar10->super_Format).super_UObject._vptr_UObject[1])();
            pTVar11 = pTVar10;
          }
          if (U_ZERO_ERROR < UVar3) goto LAB_00277b39;
        }
        if (((((local_154 & 2) != 0) && ((int)uVar12 < local_18c)) &&
            (((ulong)local_140 & 0x10) == 0)) &&
           (pTVar11 = this, pTVar10 = (TimeZoneFormat *)getTZDBTimeZoneNames(this,&status),
           status < U_ILLEGAL_ARGUMENT_ERROR)) {
          iVar5 = (*(pTVar10->super_Format).super_UObject._vptr_UObject[0xf])
                            (pTVar10,text,(ulong)start,0x76,&status);
          UVar3 = status;
          pTVar9 = (TimeZoneFormat *)CONCAT44(extraout_var_01,iVar5);
          if (status < U_ILLEGAL_ARGUMENT_ERROR) {
            local_148 = uVar14;
            if (pTVar9 == (TimeZoneFormat *)0x0) {
              uVar15 = 0xffffffff;
              local_154 = uVar15;
            }
            else {
              uVar15 = 0xffffffff;
              local_154 = 0xffffffff;
              for (uVar13 = 0; pTVar10 = pTVar9,
                  iVar4 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar9),
                  (int)uVar13 < iVar4; uVar13 = uVar13 + 1) {
                iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                  ((MatchInfoCollection *)pTVar9,uVar13);
                if ((int)uVar15 < (int)(iVar4 + start)) {
                  iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    ((MatchInfoCollection *)pTVar9,uVar13);
                  uVar15 = iVar4 + start;
                  local_154 = uVar13;
                }
              }
            }
            uVar13 = local_154;
            if ((int)uVar12 < (int)uVar15) {
              getTimeZoneID(this,(MatchInfoCollection *)pTVar9,local_154,&parsedID);
              UVar6 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                ((MatchInfoCollection *)pTVar9,uVar13);
              pTVar10 = (TimeZoneFormat *)(ulong)UVar6;
              UVar7 = getTimeType(UVar6);
              local_148 = CONCAT44(extraout_var_03,UVar7);
              local_190 = 0x7fffffff;
              uVar12 = uVar15;
            }
            uVar14 = local_148;
            pTVar11 = pTVar10;
            if (pTVar9 != (TimeZoneFormat *)0x0) goto LAB_00277dca;
          }
          else {
            pos->errorIndex = start;
            pTVar8 = (TimeZone *)0x0;
            if (pTVar9 == (TimeZoneFormat *)0x0) goto LAB_00277b39;
LAB_00277dca:
            (*(pTVar9->super_Format).super_UObject._vptr_UObject[1])();
            pTVar11 = pTVar9;
          }
          if (U_ZERO_ERROR < UVar3) goto LAB_00277b39;
        }
        UVar7 = (UTimeZoneFormatTimeType)uVar14;
        if (local_18c <= (int)uVar12) {
LAB_00277c96:
          uVar14 = (ulong)local_140 & 0x200;
          if (((int)uVar12 < local_18c) && (((ulong)local_140 & 0x200) == 0)) {
            tmpPos.errorIndex = -1;
            tmpPos.index = start;
            parseZoneID(pTVar11,text,&tmpPos,&tzID);
            iVar4 = tmpPos.index;
            if ((tmpPos.errorIndex == -1) && ((int)uVar12 < tmpPos.index)) {
              pTVar11 = (TimeZoneFormat *)&parsedID;
              icu_63::UnicodeString::setTo((UnicodeString *)pTVar11,&tzID);
              UVar7 = UTZFMT_TIME_TYPE_UNKNOWN;
              local_190 = 0x7fffffff;
              uVar12 = iVar4;
            }
          }
          if (((int)uVar12 < local_18c) && (uVar14 == 0)) {
            tmpPos.errorIndex = -1;
            tmpPos.index = start;
            parseShortZoneID(pTVar11,text,&tmpPos,&tzID);
            iVar4 = tmpPos.index;
            if ((tmpPos.errorIndex == -1) && ((int)uVar12 < tmpPos.index)) {
              pTVar11 = (TimeZoneFormat *)&parsedID;
              icu_63::UnicodeString::setTo((UnicodeString *)pTVar11,&tzID);
              UVar7 = UTZFMT_TIME_TYPE_UNKNOWN;
              local_190 = 0x7fffffff;
              uVar12 = iVar4;
            }
          }
          goto LAB_0027783a;
        }
        _hasDigitOffset_2 = UTZFMT_TIME_TYPE_UNKNOWN;
        pTVar11 = (TimeZoneFormat *)getTimeZoneGenericNames(this,&status);
        if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
           (iVar4 = TimeZoneGenericNames::findBestMatch
                              ((TimeZoneGenericNames *)pTVar11,text,start,7,&tzID,
                               (UTimeZoneFormatTimeType *)&hasDigitOffset_2,&status),
           status < U_ILLEGAL_ARGUMENT_ERROR)) {
          if ((0 < iVar4) && ((int)uVar12 < (int)(iVar4 + start))) {
            pTVar11 = (TimeZoneFormat *)&parsedID;
            icu_63::UnicodeString::setTo((UnicodeString *)pTVar11,&tzID);
            local_190 = 0x7fffffff;
            uVar12 = iVar4 + start;
            UVar7 = _hasDigitOffset_2;
          }
          goto LAB_00277c96;
        }
      }
      pos->errorIndex = start;
      pTVar8 = (TimeZone *)0x0;
    }
LAB_00277b39:
    icu_63::UnicodeString::~UnicodeString(&parsedID);
  }
LAB_00277b46:
  icu_63::UnicodeString::~UnicodeString(&tzID);
LAB_00277b50:
  ParsePosition::~ParsePosition(&tmpPos);
  return pTVar8;
}

Assistant:

TimeZone*
TimeZoneFormat::parse(UTimeZoneFormatStyle style, const UnicodeString& text, ParsePosition& pos,
        int32_t parseOptions, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    int32_t startIdx = pos.getIndex();
    int32_t maxPos = text.length();
    int32_t offset;

    // Styles using localized GMT format as fallback
    UBool fallbackLocalizedGMT = 
        (style == UTZFMT_STYLE_SPECIFIC_LONG || style == UTZFMT_STYLE_GENERIC_LONG || style == UTZFMT_STYLE_GENERIC_LOCATION);
    UBool fallbackShortLocalizedGMT =
        (style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT);

    int32_t evaluated = 0;  // bit flags representing already evaluated styles
    ParsePosition tmpPos(startIdx);

    int32_t parsedOffset = UNKNOWN_OFFSET;  // stores successfully parsed offset for later use
    int32_t parsedPos = -1;                 // stores successfully parsed offset position for later use

    // Try localized GMT format first if necessary
    if (fallbackLocalizedGMT || fallbackShortLocalizedGMT) {
        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, fallbackShortLocalizedGMT, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            // Even when the input text was successfully parsed as a localized GMT format text,
            // we may still need to evaluate the specified style if -
            //   1) GMT zero format was used, and
            //   2) The input text was not completely processed
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            parsedOffset = offset;
            parsedPos = tmpPos.getIndex();
        }
        // Note: For now, no distinction between long/short localized GMT format in the parser.
        // This might be changed in future.
        // evaluated |= (fallbackLocalizedGMT ? STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] : STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]);
        evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] | STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDBuf[32];
    UnicodeString tzID(tzIDBuf, 0, UPRV_LENGTHOF(tzIDBuf));

    UBool parseTZDBAbbrev = ((parseOptions & UTZFMT_PARSE_OPTION_TZ_DATABASE_ABBREVIATIONS) != 0);

    // Try the specified style
    switch (style) {
    case UTZFMT_STYLE_LOCALIZED_GMT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];

            break;
        }
    case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetShortLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT];

            break;
        }
    case UTZFMT_STYLE_ISO_BASIC_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetISO8601(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            // Exclude the case of UTC Indicator "Z" here
            UBool hasDigitOffset = FALSE;
            offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
            if (tmpPos.getErrorIndex() == -1 && hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_SPECIFIC_LONG:
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        {
            // Specific styles
            int32_t nameTypes = 0;
            if (style == UTZFMT_STYLE_SPECIFIC_LONG) {
                nameTypes = (UTZNM_LONG_STANDARD | UTZNM_LONG_DAYLIGHT);
            } else {
                U_ASSERT(style == UTZFMT_STYLE_SPECIFIC_SHORT);
                nameTypes = (UTZNM_SHORT_STANDARD | UTZNM_SHORT_DAYLIGHT);
            }
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, nameTypes, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (!specificMatches.isNull()) {
                int32_t matchIdx = -1;
                int32_t matchPos = -1;
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    matchPos  = startIdx + specificMatches->getMatchLengthAt(i);
                    if (matchPos > parsedPos) {
                        matchIdx = i;
                        parsedPos = matchPos;
                    }
                }
                if (matchIdx >= 0) {
                    if (timeType) {
                        *timeType = getTimeType(specificMatches->getNameTypeAt(matchIdx));
                    }
                    pos.setIndex(matchPos);
                    getTimeZoneID(specificMatches.getAlias(), matchIdx, tzID);
                    U_ASSERT(!tzID.isEmpty());
                    return TimeZone::createTimeZone(tzID);
                }
            }

            if (parseTZDBAbbrev && style == UTZFMT_STYLE_SPECIFIC_SHORT) {
                U_ASSERT((nameTypes & UTZNM_SHORT_STANDARD) != 0);
                U_ASSERT((nameTypes & UTZNM_SHORT_DAYLIGHT) != 0);

                const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
                if (U_SUCCESS(status)) {
                    LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                        tzdbTimeZoneNames->find(text, startIdx, nameTypes, status));
                    if (U_FAILURE(status)) {
                        pos.setErrorIndex(startIdx);
                        return NULL;
                    }
                    if (!tzdbNameMatches.isNull()) {
                        int32_t matchIdx = -1;
                        int32_t matchPos = -1;
                        for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                            if (matchPos > parsedPos) {
                                matchIdx = i;
                                parsedPos = matchPos;
                            }
                        }
                        if (matchIdx >= 0) {
                            if (timeType) {
                                *timeType = getTimeType(tzdbNameMatches->getNameTypeAt(matchIdx));
                            }
                            pos.setIndex(matchPos);
                            getTimeZoneID(tzdbNameMatches.getAlias(), matchIdx, tzID);
                            U_ASSERT(!tzID.isEmpty());
                            return TimeZone::createTimeZone(tzID);
                        }
                    }
                }
            }
            break;
        }
    case UTZFMT_STYLE_GENERIC_LONG:
    case UTZFMT_STYLE_GENERIC_SHORT:
    case UTZFMT_STYLE_GENERIC_LOCATION:
        {
            int32_t genericNameTypes = 0;
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
                genericNameTypes = UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_LONG:
                genericNameTypes = UTZGNM_LONG | UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
                genericNameTypes = UTZGNM_SHORT | UTZGNM_LOCATION;
                break;

            default:
                U_ASSERT(FALSE);
            }

            int32_t len = 0;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;
            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                len = gnames->findBestMatch(text, startIdx, genericNameTypes, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (len > 0) {
                // Found a match
                if (timeType) {
                    *timeType = tt;
                }
                pos.setIndex(startIdx + len);
                U_ASSERT(!tzID.isEmpty());
                return TimeZone::createTimeZone(tzID);
            }

            break;
        }
    case UTZFMT_STYLE_ZONE_ID:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseExemplarLocation(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    }
    evaluated |= STYLE_PARSE_FLAGS[style];


    if (parsedPos > startIdx) {
        // When the specified style is one of SPECIFIC_XXX or GENERIC_XXX, we tried to parse the input
        // as localized GMT format earlier. If parsedOffset is positive, it means it was successfully
        // parsed as localized GMT format, but offset digits were not detected (more specifically, GMT
        // zero format). Then, it tried to find a match within the set of display names, but could not
        // find a match. At this point, we can safely assume the input text contains the localized
        // GMT format.
        U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
        pos.setIndex(parsedPos);
        return createTimeZoneForOffset(parsedOffset);
    }

    // Failed to parse the input text as the time zone format in the specified style.
    // Check the longest match among other styles below.
    UChar parsedIDBuf[32];
    UnicodeString parsedID(parsedIDBuf, 0, UPRV_LENGTHOF(parsedIDBuf));
    UTimeZoneFormatTimeType parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;

    U_ASSERT(parsedPos < 0);
    U_ASSERT(parsedOffset == UNKNOWN_OFFSET);

    // ISO 8601
    if (parsedPos < maxPos &&
        ((evaluated & ISO_Z_STYLE_FLAG) == 0 || (evaluated & ISO_LOCAL_STYLE_FLAG) == 0)) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Note: When ISO 8601 format contains offset digits, it should not
            // collide with other formats. However, ISO 8601 UTC format "Z" (single letter)
            // may collide with other names. In this case, we need to evaluate other names.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
                U_ASSERT(parsedPos == startIdx + 1);    // only when "Z" is used
            }
        }
    }

    // Localized GMT format
    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, TRUE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    // When ParseOption.ALL_STYLES is available, we also try to look all possible display names and IDs.
    // For example, when style is GENERIC_LONG, "EST" (SPECIFIC_SHORT) is never
    // used for America/New_York. With parseAllStyles true, this code parses "EST"
    // as America/New_York.

    // Note: Adding all possible names into the trie used by the implementation is quite heavy operation,
    // which we want to avoid normally (note that we cache the trie, so this is applicable to the
    // first time only as long as the cache does not expire).

    if (parseOptions & UTZFMT_PARSE_OPTION_ALL_STYLES) {
        // Try all specific names and exemplar location names
        if (parsedPos < maxPos) {
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            int32_t specificMatchIdx = -1;
            int32_t matchPos = -1;
            if (!specificMatches.isNull()) {
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    if (startIdx + specificMatches->getMatchLengthAt(i) > matchPos) {
                        specificMatchIdx = i;
                        matchPos = startIdx + specificMatches->getMatchLengthAt(i);
                    }
                }
            }
            if (parsedPos < matchPos) {
                U_ASSERT(specificMatchIdx >= 0);
                parsedPos = matchPos;
                getTimeZoneID(specificMatches.getAlias(), specificMatchIdx, parsedID);
                parsedTimeType = getTimeType(specificMatches->getNameTypeAt(specificMatchIdx));
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        if (parseTZDBAbbrev && parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_SPECIFIC_SHORT]) == 0) {
            const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
            if (U_SUCCESS(status)) {
                LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                    tzdbTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
                if (U_FAILURE(status)) {
                    pos.setErrorIndex(startIdx);
                    return NULL;
                }
                int32_t tzdbNameMatchIdx = -1;
                int32_t matchPos = -1;
                if (!tzdbNameMatches.isNull()) {
                    for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                        if (startIdx + tzdbNameMatches->getMatchLengthAt(i) > matchPos) {
                            tzdbNameMatchIdx = i;
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                        }
                    }
                }
                if (parsedPos < matchPos) {
                    U_ASSERT(tzdbNameMatchIdx >= 0);
                    parsedPos = matchPos;
                    getTimeZoneID(tzdbNameMatches.getAlias(), tzdbNameMatchIdx, parsedID);
                    parsedTimeType = getTimeType(tzdbNameMatches->getNameTypeAt(tzdbNameMatchIdx));
                    parsedOffset = UNKNOWN_OFFSET;
                }
            }
        }
        // Try generic names
        if (parsedPos < maxPos) {
            int32_t genMatchLen = -1;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;

            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                genMatchLen = gnames->findBestMatch(text, startIdx, ALL_GENERIC_NAME_TYPES, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }

            if (genMatchLen > 0 && parsedPos < startIdx + genMatchLen) {
                parsedPos = startIdx + genMatchLen;
                parsedID.setTo(tzID);
                parsedTimeType = tt;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }

        // Try time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        // Try short time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
    }

    if (parsedPos > startIdx) {
        // Parsed successfully
        TimeZone* parsedTZ;
        if (parsedID.length() > 0) {
            parsedTZ = TimeZone::createTimeZone(parsedID);
        } else {
            U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
            parsedTZ = createTimeZoneForOffset(parsedOffset);
        }
        if (timeType) {
            *timeType = parsedTimeType;
        }
        pos.setIndex(parsedPos);
        return parsedTZ;
    }

    pos.setErrorIndex(startIdx);
    return NULL;
}